

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

Bool prvTidyFixXmlDecl(TidyDocImpl *doc)

{
  Lexer *pLVar1;
  Node *element;
  ulong uVar2;
  Node *node;
  AttVal *pAVar3;
  AttVal *pAVar4;
  ctmbstr value;
  
  node = (doc->root).content;
  pLVar1 = doc->lexer;
  if ((node == (Node *)0x0) || (node->type != XmlDecl)) {
    node = (Node *)(*pLVar1->allocator->vtbl->alloc)(pLVar1->allocator,0x68);
    node->parent = (Node *)0x0;
    node->prev = (Node *)0x0;
    node->next = (Node *)0x0;
    node->content = (Node *)0x0;
    node->last = (Node *)0x0;
    node->attributes = (AttVal *)0x0;
    node->was = (Dict *)0x0;
    node->tag = (Dict *)0x0;
    node->element = (tmbstr)0x0;
    node->start = 0;
    node->end = 0;
    node->type = RootNode;
    node->line = 0;
    node->column = 0;
    node->closed = no;
    node->implicit = no;
    node->linebreak = no;
    if (pLVar1 != (Lexer *)0x0) {
      node->line = pLVar1->lines;
      node->column = pLVar1->columns;
    }
    node->type = XmlDecl;
    element = (doc->root).content;
    if (element == (Node *)0x0) {
      (doc->root).content = node;
    }
    else {
      prvTidyInsertNodeBeforeElement(element,node);
    }
  }
  pAVar3 = prvTidyGetAttrByName(node,"version");
  pAVar4 = prvTidyGetAttrByName(node,"encoding");
  if ((pAVar4 == (AttVal *)0x0) && (uVar2 = (doc->config).value[0x3c].v, uVar2 != 4)) {
    value = prvTidyGetEncodingNameFromTidyId((uint)uVar2);
    if (value != (ctmbstr)0x0) {
      prvTidyAddAttribute(doc,node,"encoding",value);
    }
  }
  if (pAVar3 == (AttVal *)0x0) {
    prvTidyAddAttribute(doc,node,"version","1.0");
  }
  return yes;
}

Assistant:

Bool TY_(FixXmlDecl)( TidyDocImpl* doc )
{
    Node* xml;
    AttVal *version, *encoding;
    Lexer*lexer = doc->lexer;
    Node* root = &doc->root;

    if ( root->content && root->content->type == XmlDecl )
    {
        xml = root->content;
    }
    else
    {
        xml = TY_(NewNode)(lexer->allocator, lexer);
        xml->type = XmlDecl;
        if ( root->content )
            TY_(InsertNodeBeforeElement)(root->content, xml);
        else
            root->content = xml;
    }

    version = TY_(GetAttrByName)(xml, "version");
    encoding = TY_(GetAttrByName)(xml, "encoding");

    /*
      We need to insert a check if declared encoding 
      and output encoding mismatch and fix the XML
      declaration accordingly!!!
    */

    if ( encoding == NULL && cfg(doc, TidyOutCharEncoding) != UTF8 )
    {
        ctmbstr enc = TY_(GetEncodingNameFromTidyId)(cfg(doc, TidyOutCharEncoding));
        if ( enc )
            TY_(AddAttribute)( doc, xml, "encoding", enc );
    }

    if ( version == NULL )
        TY_(AddAttribute)( doc, xml, "version", "1.0" );
    return yes;
}